

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O3

void psd_add_gws(pcp_ctx_t *ctx)

{
  int iVar1;
  int pcp_server_index;
  pcp_errno pVar2;
  pcp_server_t *ppVar3;
  char *fmt;
  pcp_loglvl_e log_level;
  in6_addr *__a;
  in6_addr *ip;
  sockaddr_in6 *gws;
  sockaddr_in6 *local_38;
  
  local_38 = (sockaddr_in6 *)0x0;
  iVar1 = getgateways(&local_38);
  if (0 < iVar1) {
    ip = &local_38->sin6_addr;
    iVar1 = iVar1 + 1;
    do {
      if (((((ip->__in6_u).__u6_addr32[0] != 0) || ((ip->__in6_u).__u6_addr32[1] != 0)) ||
          (((((ip->__in6_u).__u6_addr32[2] != 0xffff0000 || ((ip->__in6_u).__u6_addr32[3] != 0)) &&
            (((ip->__in6_u).__u6_addr32[2] != 0 || ((ip->__in6_u).__u6_addr32[3] != 0)))) &&
           ((((ip->__in6_u).__u6_addr32[2] != 0xffff0000 ||
             ((((ip->__in6_u).__u6_addr8[0xc] != '\0' || ((ip->__in6_u).__u6_addr8[0xd] != '\0')) ||
              ((ip->__in6_u).__u6_addr8[0xe] != '\0')))) || ((ip->__in6_u).__u6_addr8[0xf] != '\0'))
           )))) && (((ppVar3 = get_pcp_server_by_ip(ctx,ip,*(uint32_t *)(ip + 1)),
                     ppVar3 == (pcp_server_t *)0x0 &&
                     (pcp_server_index = pcp_new_server(ctx,ip,0xe714,*(uint32_t *)(ip + 1)),
                     -1 < pcp_server_index)) &&
                    (ppVar3 = get_pcp_server(ctx,pcp_server_index), ppVar3 != (pcp_server_t *)0x0)))
         ) {
        pVar2 = psd_fill_pcp_server_src(ppVar3);
        if (pVar2 == PCP_ERR_SUCCESS) {
          log_level = PCP_LOGLVL_INFO;
          fmt = "Found gateway %s. Added as possible PCP server.";
        }
        else {
          log_level = PCP_LOGLVL_ERR;
          fmt = "Failed to initialize gateway %s as a PCP server.";
        }
        pcp_logger(log_level,fmt,ppVar3->pcp_server_paddr);
      }
      ip = (in6_addr *)((long)(ip + 1) + 0xc);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  free(local_38);
  return;
}

Assistant:

void psd_add_gws(pcp_ctx_t *ctx) {
    struct sockaddr_in6 *gws = NULL, *gw;
    int rcount = getgateways(&gws);

    gw = gws;

    for (; rcount > 0; rcount--, gw++) {
        int pcps_indx;

        if ((IN6_IS_ADDR_V4MAPPED(&gw->sin6_addr)) &&
            (S6_ADDR32(&gw->sin6_addr)[3] == INADDR_ANY))
            continue;

        if (IPV6_IS_ADDR_ANY(&gw->sin6_addr))
            continue;

        if (get_pcp_server_by_ip(ctx, &gw->sin6_addr, gw->sin6_scope_id))
            continue;

        pcps_indx = pcp_new_server(ctx, &gw->sin6_addr, ntohs(PCP_SERVER_PORT),
                                   gw->sin6_scope_id);
        if (pcps_indx >= 0) {
            pcp_server_t *s = get_pcp_server(ctx, pcps_indx);
            if (!s)
                continue;

            if (psd_fill_pcp_server_src(s)) {
                PCP_LOG(PCP_LOGLVL_ERR,
                        "Failed to initialize gateway %s as a PCP server.",
                        s ? s->pcp_server_paddr : "NULL pointer!!!");
            } else {
                PCP_LOG(PCP_LOGLVL_INFO,
                        "Found gateway %s. "
                        "Added as possible PCP server.",
                        s ? s->pcp_server_paddr : "NULL pointer!!!");
            }
        }
    }
    free(gws);
}